

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.cpp
# Opt level: O0

String * __thiscall
String::token(String *__return_storage_ptr__,String *this,char separator,usize *start)

{
  usize uVar1;
  char *pcVar2;
  char *pcVar3;
  usize len;
  char *endStr;
  usize *start_local;
  char separator_local;
  String *this_local;
  String *result;
  
  pcVar2 = find(this,separator,*start);
  if (pcVar2 == (char *)0x0) {
    substr(__return_storage_ptr__,this,*start,-1);
    *start = this->data->len;
  }
  else {
    pcVar3 = operator_cast_to_char_(this);
    uVar1 = *start;
    substr(__return_storage_ptr__,this,*start,(long)pcVar2 - (long)(pcVar3 + uVar1));
    *start = ((long)pcVar2 - (long)(pcVar3 + uVar1)) + 1 + *start;
  }
  return __return_storage_ptr__;
}

Assistant:

String String::token(char separator, usize& start) const
{
  const char* endStr = find(separator, start);
  if(endStr)
  {
    usize len = endStr - (*this + start);
    String result = String::substr(start, len);
    start += len + 1;
    return result;
  }
  String result = substr(start);
  start = data->len;
  return result;
}